

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::ResolutionPass(ResolutionPass *this,Allocator *a,ModuleBase *m)

{
  allocator<char> local_89;
  string local_88;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_68;
  
  this->allocator = a;
  this->module = m;
  (this->intrinsicsNamespacePath).pathSections.items =
       (Identifier *)(this->intrinsicsNamespacePath).pathSections.space;
  (this->intrinsicsNamespacePath).pathSections.numActive = 0;
  (this->intrinsicsNamespacePath).pathSections.numAllocated = 8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"soul::intrinsics",&local_89);
  IdentifierPath::fromString((IdentifierPath *)&local_68,&a->identifiers,&local_88);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&(this->intrinsicsNamespacePath).pathSections,&local_68);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

ResolutionPass (AST::Allocator& a, AST::ModuleBase& m) : allocator (a), module (m)
    {
        intrinsicsNamespacePath = IdentifierPath::fromString (allocator.identifiers, getIntrinsicsNamespaceName());
    }